

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::showEncryption(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  Pipeline *pPVar2;
  int P;
  int R;
  encryption_method_e file_method;
  encryption_method_e string_method;
  encryption_method_e stream_method;
  int V;
  string local_198;
  QPDFJob *local_178;
  string local_170;
  string local_150;
  string user_password;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string encryption_key;
  
  R = 0;
  P = 0;
  V = 0;
  file_method = e_unknown;
  string_method = file_method;
  stream_method = file_method;
  local_178 = this;
  QPDFLogger::getInfo((QPDFLogger *)&user_password,
                      SUB81((((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->log).
                            super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&user_password._M_string_length);
  bVar1 = QPDF::isEncrypted(pdf,&R,&P,&V,&stream_method,&string_method,&file_method);
  if (bVar1) {
    pPVar2 = Pipeline::operator<<((Pipeline *)user_password._M_dataplus._M_p,"R = ");
    pPVar2 = Pipeline::operator<<(pPVar2,R);
    Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<((Pipeline *)user_password._M_dataplus._M_p,"P = ");
    pPVar2 = Pipeline::operator<<(pPVar2,P);
    Pipeline::operator<<(pPVar2,"\n");
    QPDF::getTrimmedUserPassword_abi_cxx11_(&user_password,pdf);
    QPDF::getEncryptionKey_abi_cxx11_(&encryption_key,pdf);
    pPVar2 = Pipeline::operator<<((Pipeline *)user_password._M_dataplus._M_p,"User password = ");
    pPVar2 = Pipeline::operator<<(pPVar2,&user_password);
    Pipeline::operator<<(pPVar2,"\n");
    if (((local_178->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        show_encryption_key == true) {
      pPVar2 = Pipeline::operator<<((Pipeline *)user_password._M_dataplus._M_p,"Encryption key = ");
      QUtil::hex_encode(&local_198,&encryption_key);
      pPVar2 = Pipeline::operator<<(pPVar2,&local_198);
      Pipeline::operator<<(pPVar2,"\n");
      std::__cxx11::string::~string((string *)&local_198);
    }
    bVar1 = QPDF::ownerPasswordMatched(pdf);
    if (bVar1) {
      Pipeline::operator<<
                ((Pipeline *)user_password._M_dataplus._M_p,"Supplied password is owner password\n")
      ;
    }
    bVar1 = QPDF::userPasswordMatched(pdf);
    if (bVar1) {
      Pipeline::operator<<
                ((Pipeline *)user_password._M_dataplus._M_p,"Supplied password is user password\n");
    }
    pPVar2 = Pipeline::operator<<
                       ((Pipeline *)user_password._M_dataplus._M_p,"extract for accessibility: ");
    bVar1 = QPDF::allowAccessibility(pdf);
    show_bool_abi_cxx11_(&local_198,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_198);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"extract for any purpose: ");
    bVar1 = QPDF::allowExtractAll(pdf);
    show_bool_abi_cxx11_(&local_150,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_150);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"print low resolution: ");
    bVar1 = QPDF::allowPrintLowRes(pdf);
    show_bool_abi_cxx11_(&local_170,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_170);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"print high resolution: ");
    bVar1 = QPDF::allowPrintHighRes(pdf);
    show_bool_abi_cxx11_(&local_70,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_70);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify document assembly: ");
    bVar1 = QPDF::allowModifyAssembly(pdf);
    show_bool_abi_cxx11_(&local_90,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_90);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify forms: ");
    bVar1 = QPDF::allowModifyForm(pdf);
    show_bool_abi_cxx11_(&local_b0,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_b0);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify annotations: ");
    bVar1 = QPDF::allowModifyAnnotation(pdf);
    show_bool_abi_cxx11_(&local_d0,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_d0);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify other: ");
    bVar1 = QPDF::allowModifyOther(pdf);
    show_bool_abi_cxx11_(&local_f0,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_f0);
    pPVar2 = Pipeline::operator<<(pPVar2,"\n");
    pPVar2 = Pipeline::operator<<(pPVar2,"modify anything: ");
    bVar1 = QPDF::allowModifyAll(pdf);
    show_bool_abi_cxx11_(&local_110,bVar1);
    pPVar2 = Pipeline::operator<<(pPVar2,&local_110);
    Pipeline::operator<<(pPVar2,"\n");
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_198);
    if (3 < V) {
      pPVar2 = Pipeline::operator<<
                         ((Pipeline *)user_password._M_dataplus._M_p,"stream encryption method: ");
      show_encryption_method_abi_cxx11_(&local_198,stream_method);
      pPVar2 = Pipeline::operator<<(pPVar2,&local_198);
      pPVar2 = Pipeline::operator<<(pPVar2,"\n");
      pPVar2 = Pipeline::operator<<(pPVar2,"string encryption method: ");
      show_encryption_method_abi_cxx11_(&local_150,string_method);
      pPVar2 = Pipeline::operator<<(pPVar2,&local_150);
      pPVar2 = Pipeline::operator<<(pPVar2,"\n");
      pPVar2 = Pipeline::operator<<(pPVar2,"file encryption method: ");
      show_encryption_method_abi_cxx11_(&local_170,file_method);
      pPVar2 = Pipeline::operator<<(pPVar2,&local_170);
      Pipeline::operator<<(pPVar2,"\n");
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_198);
    }
    std::__cxx11::string::~string((string *)&encryption_key);
    std::__cxx11::string::~string((string *)&user_password);
  }
  else {
    Pipeline::operator<<((Pipeline *)user_password._M_dataplus._M_p,"File is not encrypted\n");
  }
  return;
}

Assistant:

void
QPDFJob::showEncryption(QPDF& pdf)
{
    // Extract /P from /Encrypt
    int R = 0;
    int P = 0;
    int V = 0;
    QPDF::encryption_method_e stream_method = QPDF::e_unknown;
    QPDF::encryption_method_e string_method = QPDF::e_unknown;
    QPDF::encryption_method_e file_method = QPDF::e_unknown;
    auto& cout = *m->log->getInfo();
    if (!pdf.isEncrypted(R, P, V, stream_method, string_method, file_method)) {
        cout << "File is not encrypted\n";
    } else {
        cout << "R = " << R << "\n";
        cout << "P = " << P << "\n";
        std::string user_password = pdf.getTrimmedUserPassword();
        std::string encryption_key = pdf.getEncryptionKey();
        cout << "User password = " << user_password << "\n";
        if (m->show_encryption_key) {
            cout << "Encryption key = " << QUtil::hex_encode(encryption_key) << "\n";
        }
        if (pdf.ownerPasswordMatched()) {
            cout << "Supplied password is owner password\n";
        }
        if (pdf.userPasswordMatched()) {
            cout << "Supplied password is user password\n";
        }
        cout << "extract for accessibility: " << show_bool(pdf.allowAccessibility()) << "\n"
             << "extract for any purpose: " << show_bool(pdf.allowExtractAll()) << "\n"
             << "print low resolution: " << show_bool(pdf.allowPrintLowRes()) << "\n"
             << "print high resolution: " << show_bool(pdf.allowPrintHighRes()) << "\n"
             << "modify document assembly: " << show_bool(pdf.allowModifyAssembly()) << "\n"
             << "modify forms: " << show_bool(pdf.allowModifyForm()) << "\n"
             << "modify annotations: " << show_bool(pdf.allowModifyAnnotation()) << "\n"
             << "modify other: " << show_bool(pdf.allowModifyOther()) << "\n"
             << "modify anything: " << show_bool(pdf.allowModifyAll()) << "\n";
        if (V >= 4) {
            cout << "stream encryption method: " << show_encryption_method(stream_method) << "\n"
                 << "string encryption method: " << show_encryption_method(string_method) << "\n"
                 << "file encryption method: " << show_encryption_method(file_method) << "\n";
        }
    }
}